

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

int AF_APlayerPawn_ResetAirSupply
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  APlayerPawn *this;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00466cdb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00466ccb:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00466cdb:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x503,
                  "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (APlayerPawn *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (APlayerPawn *)0x0) goto LAB_00466c63;
    bVar1 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(APlayerPawn))";
      goto LAB_00466cdb;
    }
  }
  else {
    if (this != (APlayerPawn *)0x0) goto LAB_00466ccb;
LAB_00466c63:
    this = (APlayerPawn *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_00466c8e:
      bVar1 = APlayerPawn::ResetAirSupply(this,param[1].field_0.i != 0);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x505,
                        "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar1);
        iVar2 = 1;
      }
      return iVar2;
    }
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_00466c8e;
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x504,
                "int AF_APlayerPawn_ResetAirSupply(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(APlayerPawn, ResetAirSupply)
{
	PARAM_SELF_PROLOGUE(APlayerPawn);
	PARAM_BOOL_DEF(playgasp);
	ACTION_RETURN_BOOL(self->ResetAirSupply(playgasp));
}